

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdt.cc
# Opt level: O3

bool __thiscall dtc::fdt::property_value::try_to_merge(property_value *this,property_value *other)

{
  value_type vVar1;
  
  resolve_type(this);
  vVar1 = this->type;
  if ((vVar1 == BINARY) || (vVar1 == PHANDLE)) {
    if ((other->type == PHANDLE) || (other->type == BINARY)) {
      this->type = BINARY;
      std::vector<unsigned_char,std::allocator<unsigned_char>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)&this->byte_data,
                 (this->byte_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                 ._M_impl.super__Vector_impl_data._M_finish,
                 (other->byte_data).
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 (other->byte_data).
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish);
      return true;
    }
  }
  else if (vVar1 == EMPTY) {
    std::__cxx11::string::_M_assign((string *)this);
    std::__cxx11::string::_M_assign((string *)&this->string_data);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              (&this->byte_data,&other->byte_data);
    this->type = other->type;
  }
  return false;
}

Assistant:

bool
property_value::try_to_merge(property_value &other)
{
	resolve_type();
	switch (type)
	{
		case UNKNOWN:
			__builtin_unreachable();
			assert(0);
			return false;
		case EMPTY:
			*this = other;
			[[fallthrough]];
		case STRING:
		case STRING_LIST:
		case CROSS_REFERENCE:
			return false;
		case PHANDLE:
		case BINARY:
			if (other.type == PHANDLE || other.type == BINARY)
			{
				type = BINARY;
				byte_data.insert(byte_data.end(), other.byte_data.begin(),
				                 other.byte_data.end());
				return true;
			}
	}
	return false;
}